

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>
::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *valueMap,Index columnIndex)

{
  uint uVar1;
  node_ptr plVar2;
  node_ptr plVar3;
  pointer puVar4;
  vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
  *pvVar5;
  void *pvVar6;
  undefined8 uVar7;
  reference value;
  long lVar8;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
  **ppEVar9;
  iterator iVar10;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
  *value_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar11;
  node_ptr next;
  iterator iVar12;
  pointer plVar13;
  ulong uVar14;
  undefined8 *puVar15;
  long *plVar16;
  undefined8 *puVar17;
  Entry *entry;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
  **local_78;
  iterator iStack_70;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
  **local_68;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
  *local_58;
  ID_index local_4c;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  long *local_38;
  
  if (*(long *)(this + 0x40) == 0) {
    puVar17 = *(undefined8 **)(this + 0x10);
    puVar15 = *(undefined8 **)(this + 0x18);
    pvVar11 = valueMap;
    if (puVar17 != puVar15) {
      do {
        local_40 = pvVar11;
        value = (reference)*puVar17;
        if ((*(long *)(this + 8) != 0) &&
           (plVar2 = (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
           plVar2 != (node_ptr)0x0)) {
          plVar3 = (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
          plVar3->next_ = plVar2;
          plVar2->prev_ = plVar3;
          (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ =
               (node_ptr)0x0;
          (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ =
               (node_ptr)0x0;
        }
        if (columnIndex != 0xffffffff) {
          (value->super_Entry_column_index_option).columnIndex_ = columnIndex;
        }
        puVar4 = (valueMap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        if ((ulong)((long)(valueMap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2) <=
            (ulong)value->rowIndex_) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        uVar1 = puVar4[value->rowIndex_];
        value->rowIndex_ = uVar1;
        pvVar5 = *(vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                   **)(this + 8);
        if (pvVar5 != (vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                       *)0x0) {
          plVar13 = (pvVar5->
                    super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(pvVar5->
                            super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)plVar13 >> 4) <
              (ulong)(uVar1 + 1)) {
            std::
            vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
            ::resize(pvVar5,(ulong)(uVar1 + 1));
            plVar13 = (pointer)**(undefined8 **)(this + 8);
          }
          boost::intrusive::
          list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
          ::push_back(&plVar13[uVar1].super_type,value);
          valueMap = local_40;
        }
        puVar17 = puVar17 + 1;
        pvVar11 = local_40;
      } while (puVar17 != puVar15);
      puVar17 = *(undefined8 **)(this + 0x10);
      puVar15 = *(undefined8 **)(this + 0x18);
    }
    if (puVar17 != puVar15) {
      uVar14 = (long)puVar15 - (long)puVar17 >> 3;
      lVar8 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>const*)_1_>>
                (puVar17,puVar15,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>const*)_1_>>
                (puVar17,puVar15);
      return;
    }
  }
  else {
    local_48 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)(this + 0x28);
    local_78 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                **)0x0;
    iStack_70._M_current =
         (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
          **)0x0;
    local_68 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                **)0x0;
    plVar16 = *(long **)(this + 0x10);
    local_38 = *(long **)(this + 0x18);
    if (plVar16 != local_38) {
      do {
        local_58 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                    *)*plVar16;
        local_4c = local_58->rowIndex_;
        iVar12 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(local_48,&local_4c);
        if (iVar12.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          if ((*(long *)(this + 8) != 0) &&
             (plVar2 = (local_58->super_Row_hook).super_type.super_type.super_list_node<void_*>.
                       next_, plVar2 != (node_ptr)0x0)) {
            plVar3 = (local_58->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
            plVar3->next_ = plVar2;
            plVar2->prev_ = plVar3;
            (local_58->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ =
                 (node_ptr)0x0;
            (local_58->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ =
                 (node_ptr)0x0;
          }
          if (columnIndex != 0xffffffff) {
            (local_58->super_Entry_column_index_option).columnIndex_ = columnIndex;
          }
          puVar4 = (valueMap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(valueMap->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar4 >> 2) <=
              (ulong)local_58->rowIndex_) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          local_58->rowIndex_ = puVar4[local_58->rowIndex_];
          if (iStack_70._M_current == local_68) {
            std::
            vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*>>
            ::
            _M_realloc_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*const&>
                      ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*>>
                        *)&local_78,iStack_70,&local_58);
          }
          else {
            *iStack_70._M_current = local_58;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
          value_00 = local_58;
          pvVar5 = *(vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                     **)(this + 8);
          if (pvVar5 != (vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                         *)0x0) {
            uVar1 = local_58->rowIndex_;
            plVar13 = (pvVar5->
                      super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar14 = (ulong)(uVar1 + 1);
            if ((ulong)((long)(pvVar5->
                              super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)plVar13 >> 4) <
                uVar14) {
              std::
              vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
              ::resize(pvVar5,uVar14);
              plVar13 = (pointer)**(undefined8 **)(this + 8);
            }
            boost::intrusive::
            list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
            ::push_back(&plVar13[uVar1].super_type,value_00);
          }
        }
        else {
          if (((*(long *)(this + 8) != 0) ||
              (local_58 !=
               (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                *)0x0)) &&
             (plVar2 = (local_58->super_Row_hook).super_type.super_type.super_list_node<void_*>.
                       next_, plVar2 != (node_ptr)0x0)) {
            plVar3 = (local_58->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
            plVar3->next_ = plVar2;
            plVar2->prev_ = plVar3;
          }
          operator_delete(local_58,0x20);
        }
        iVar10._M_current = iStack_70._M_current;
        ppEVar9 = local_78;
        plVar16 = plVar16 + 1;
      } while (plVar16 != local_38);
      if (local_78 != iStack_70._M_current) {
        uVar14 = (long)iStack_70._M_current - (long)local_78 >> 3;
        lVar8 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>const*)_2_>>
                  (local_78,iStack_70._M_current,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>const*)_2_>>
                  (ppEVar9,iVar10._M_current);
      }
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(local_48);
    pvVar6 = *(void **)(this + 0x10);
    uVar7 = *(undefined8 *)(this + 0x18);
    lVar8 = *(long *)(this + 0x20);
    *(Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
      ***)(this + 0x10) = local_78;
    *(Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
      ***)(this + 0x18) = iStack_70._M_current;
    *(Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
      ***)(this + 0x20) = local_68;
    if (pvVar6 != (void *)0x0) {
      local_78 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                  **)pvVar6;
      iStack_70._M_current =
           (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
            **)uVar7;
      local_68 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                  **)lVar8;
      operator_delete(pvVar6,lVar8 - (long)pvVar6);
    }
  }
  return;
}

Assistant:

inline void Vector_column<Master_matrix>::reorder(const Row_index_map& valueMap, [[maybe_unused]] Index columnIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  if (erasedValues_.empty()) {  // to avoid useless push_backs.
    for (Entry* entry : column_) {
      if constexpr (Master_matrix::Option_list::has_row_access) {
        RA_opt::unlink(entry);
        if (columnIndex != Master_matrix::template get_null_value<Index>()) entry->set_column_index(columnIndex);
      }
      entry->set_row_index(valueMap.at(entry->get_row_index()));
      if constexpr (Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access)
        RA_opt::insert_entry(entry->get_row_index(), entry);
    }

    // all entries have to be deleted first, to avoid problem with insertion when row is a set
    if constexpr (!Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access) {
      for (Entry* entry : column_) {
        RA_opt::insert_entry(entry->get_row_index(), entry);
      }
    }

    std::sort(column_.begin(), column_.end(), [](const Entry* c1, const Entry* c2) { return *c1 < *c2; });
  } else {
    Column_support newColumn;
    for (Entry* entry : column_) {
      if (erasedValues_.find(entry->get_row_index()) == erasedValues_.end()) {
        if constexpr (Master_matrix::Option_list::has_row_access) {
          RA_opt::unlink(entry);
          if (columnIndex != Master_matrix::template get_null_value<Index>()) entry->set_column_index(columnIndex);
        }
        entry->set_row_index(valueMap.at(entry->get_row_index()));
        newColumn.push_back(entry);
        if constexpr (Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access)
          RA_opt::insert_entry(entry->get_row_index(), entry);
      } else {
        _delete_entry(entry);
      }
    }
    // all entries have to be deleted first, to avoid problem with insertion when row is a set
    if constexpr (!Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access) {
      for (Entry* entry : column_) {
        RA_opt::insert_entry(entry->get_row_index(), entry);
      }
    }
    std::sort(newColumn.begin(), newColumn.end(), [](const Entry* c1, const Entry* c2) { return *c1 < *c2; });
    erasedValues_.clear();
    column_.swap(newColumn);
  }
}